

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

uint kj::_::chooseBucket(uint hash,uint count)

{
  uint count_local;
  uint hash_local;
  
  if (count == 1) {
    count_local = 0;
  }
  else if (count == 3) {
    count_local = hash % 3;
  }
  else if (count == 5) {
    count_local = hash % 5;
  }
  else if (count == 0xb) {
    count_local = hash % 0xb;
  }
  else if (count == 0x17) {
    count_local = hash % 0x17;
  }
  else if (count == 0x35) {
    count_local = hash % 0x35;
  }
  else if (count == 0x61) {
    count_local = hash % 0x61;
  }
  else if (count == 0xc1) {
    count_local = hash % 0xc1;
  }
  else if (count == 0x185) {
    count_local = hash % 0x185;
  }
  else if (count == 0x301) {
    count_local = hash % 0x301;
  }
  else if (count == 0x607) {
    count_local = hash % 0x607;
  }
  else if (count == 0xc07) {
    count_local = hash % 0xc07;
  }
  else if (count == 0x1807) {
    count_local = hash % 0x1807;
  }
  else if (count == 0x3001) {
    count_local = hash % 0x3001;
  }
  else if (count == 0x6011) {
    count_local = hash % 0x6011;
  }
  else if (count == 0xc005) {
    count_local = hash % 0xc005;
  }
  else if (count == 0x1800d) {
    count_local = hash % 0x1800d;
  }
  else if (count == 0x30005) {
    count_local = hash % 0x30005;
  }
  else if (count == 0x60019) {
    count_local = hash % 0x60019;
  }
  else if (count == 0xc0001) {
    count_local = hash % 0xc0001;
  }
  else if (count == 0x180005) {
    count_local = hash % 0x180005;
  }
  else if (count == 0x30000b) {
    count_local = hash % 0x30000b;
  }
  else if (count == 0x60000d) {
    count_local = hash % 0x60000d;
  }
  else if (count == 0xc00005) {
    count_local = hash % 0xc00005;
  }
  else if (count == 0x1800013) {
    count_local = hash % 0x1800013;
  }
  else if (count == 0x3000005) {
    count_local = hash % 0x3000005;
  }
  else if (count == 0x6000017) {
    count_local = hash % 0x6000017;
  }
  else if (count == 0xc000013) {
    count_local = hash % 0xc000013;
  }
  else if (count == 0x18000005) {
    count_local = hash % 0x18000005;
  }
  else if (count == 0x30000059) {
    count_local = hash % 0x30000059;
  }
  else if (count == 0x60000005) {
    count_local = hash % 0x60000005;
  }
  else {
    count_local = hash % count;
  }
  return count_local;
}

Assistant:

uint chooseBucket(uint hash, uint count) {
  // Integer modulus is really, really slow. It turns out that the compiler can generate much
  // faster code if the denominator is a constant. Since we have a fixed set of possible
  // denominators, a big old switch() statement is a win.

  // TODO(perf): Consider using power-of-two bucket sizes. We can safely do so as long as we demand
  //   high-quality hash functions -- kj::hashCode() needs good diffusion even for integers, can't
  //   just be a cast. Also be sure to implement Robin Hood hashing to avoid extremely bad negative
  //   lookup time when elements have sequential hashes (otherwise, it could be necessary to scan
  //   the entire list to determine that an element isn't present).

  switch (count) {
#define HANDLE(i) case i##u: return hash % i##u
    HANDLE(         1);
    HANDLE(         3);
    HANDLE(         5);
    HANDLE(        11);
    HANDLE(        23);
    HANDLE(        53);
    HANDLE(        97);
    HANDLE(       193);
    HANDLE(       389);
    HANDLE(       769);
    HANDLE(      1543);
    HANDLE(      3079);
    HANDLE(      6151);
    HANDLE(     12289);
    HANDLE(     24593);
    HANDLE(     49157);
    HANDLE(     98317);
    HANDLE(    196613);
    HANDLE(    393241);
    HANDLE(    786433);
    HANDLE(   1572869);
    HANDLE(   3145739);
    HANDLE(   6291469);
    HANDLE(  12582917);
    HANDLE(  25165843);
    HANDLE(  50331653);
    HANDLE( 100663319);
    HANDLE( 201326611);
    HANDLE( 402653189);
    HANDLE( 805306457);
    HANDLE(1610612741);
#undef HANDLE
    default: return hash % count;
  }
}